

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O2

qsizetype QtPrivate::lengthHelperPointer<char>(char *data)

{
  long lVar1;
  long lVar2;
  
  lVar2 = -1;
  do {
    lVar1 = lVar2 + 1;
    lVar2 = lVar2 + 1;
  } while (data[lVar1] != '\0');
  return lVar2;
}

Assistant:

static constexpr qsizetype lengthHelperPointer(const Char *data) noexcept
{
    // std::char_traits can only be used with one of the regular char types
    // (char, char16_t, wchar_t, but not uchar or QChar), so we roll the loop
    // out by ourselves.
    qsizetype i = 0;
    if (!data)
        return i;
    while (data[i] != Char(0))
        ++i;
    return i;
}